

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall
front::syntax::SyntaxAnalyze::gm_func_param
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
          *params,int funcLayerNum,
          vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *genValues)

{
  element_type *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ArraySymbol *this_01;
  ExpressNode *this_02;
  IntSymbol *pIVar4;
  string *name_00;
  SharedSyPtr symbol;
  SharedExNdPtr dimension;
  SharedExNdPtr genNode;
  undefined1 local_1c8 [48];
  SharedSyPtr genValue;
  SharedExNdPtr holderDimension;
  SharedSyPtr local_160;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_100;
  string name;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  match_one_word(this,INTTK);
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_1c8,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  bVar2 = try_word(this,1,LBRACK);
  if (bVar2) {
    this_01 = (ArraySymbol *)operator_new(0x78);
    std::__cxx11::string::string((string *)&local_90,(string *)&name);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_01,&local_90,&local_160,funcLayerNum + 1,false,true);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_01
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_160.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_90);
    match_one_word(this,LBRACK);
    this_02 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_02);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)
               &holderDimension,this_02);
    (holderDimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_type = VAR;
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)local_1c8);
    uVar1 = local_1c8._0_8_;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_100,
               &holderDimension.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 *)(uVar1 + 0x48),(value_type *)&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
    match_one_word(this,RBRACK);
    while( true ) {
      bVar2 = try_word(this,1,LBRACK);
      if (!bVar2) break;
      dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      match_one_word(this,LBRACK);
      gm_exp((SyntaxAnalyze *)local_1c8);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&dimension.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)local_1c8)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
      match_one_word(this,RBRACK);
      if ((dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_type == CNS) {
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)local_1c8);
        uVar1 = local_1c8._0_8_;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_110,
                   &dimension.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)(uVar1 + 0x48),(value_type *)&local_110);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
      }
      else {
        genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        genNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        genNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pIVar4 = (IntSymbol *)operator_new(0x40);
        hp_gen_save_value_abi_cxx11_(&local_b0,this);
        front::symbol::IntSymbol::IntSymbol(pIVar4,&local_b0,funcLayerNum + 1,false,0);
        std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
        reset<front::symbol::IntSymbol>
                  (&genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,
                   pIVar4);
        std::__cxx11::string::~string((string *)&local_b0);
        std::
        pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::shared_ptr<front::symbol::Symbol>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c8,
                   (shared_ptr<front::symbol::Symbol> *)
                   &genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,
                   &(dimension.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
        std::
        vector<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>
                  ((vector<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,std::__cxx11::string>>>
                    *)genValues,
                   (pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c8);
        std::
        pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1c8);
        std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_120,
                   &genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
        symbolTable::SymbolTable::push_symbol(&this->symbolTable,(SharedSyPtr *)&local_120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
        this_00 = genNode.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        (genNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_type = VAR;
        (genNode.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_operation = ASSIGN;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_130,
                   &dimension.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        express::ExpressNode::addChild(this_00,(SharedExNdPtr *)&local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(genNode.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)local_1c8);
        uVar1 = local_1c8._0_8_;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_140,
                   &genNode.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)(uVar1 + 0x48),(value_type *)&local_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&genNode.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&genValue.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dimension.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&holderDimension.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    pIVar4 = (IntSymbol *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_d0,(string *)&name);
    front::symbol::IntSymbol::IntSymbol(pIVar4,&local_d0,funcLayerNum + 1,false,0);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,pIVar4)
    ;
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::push_back(params,&symbol);
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_150,
             &symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
  symbolTable::SymbolTable::push_symbol(&this->symbolTable,(SharedSyPtr *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  iVar3 = (**(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Symbol)();
  if (iVar3 == 0) {
    name_00 = &local_70;
    std::__cxx11::string::string
              ((string *)name_00,
               (string *)
               &(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_name);
    irGenerator::irGenerator::ir_declare_param
              (&this->irGenerator,name_00,INT,
               (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->id);
  }
  else {
    if (iVar3 != 2) goto LAB_001861c7;
    name_00 = &local_50;
    std::__cxx11::string::string
              ((string *)name_00,
               (string *)
               &(symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_name);
    irGenerator::irGenerator::ir_declare_param
              (&this->irGenerator,name_00,Ptr,
               (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->id);
  }
  std::__cxx11::string::~string((string *)name_00);
LAB_001861c7:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SyntaxAnalyze::gm_func_param(
    vector<SharedSyPtr> &params, int funcLayerNum,
    vector<std::pair<SharedSyPtr, string>> &genValues) {
  string name;
  SharedSyPtr symbol;

  match_one_word(Token::INTTK);
  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 funcLayerNum + 1, false, true));
    match_one_word(Token::LBRACK);

    SharedExNdPtr holderDimension = SharedExNdPtr(new ExpressNode());
    holderDimension->_type = NodeType::VAR;
    std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(
        SharedExNdPtr(holderDimension));

    match_one_word(Token::RBRACK);

    while (try_word(1, Token::LBRACK)) {
      SharedExNdPtr dimension;
      match_one_word(Token::LBRACK);
      dimension = gm_exp();
      match_one_word(Token::RBRACK);
      if (dimension->_type == NodeType::CNS) {
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(dimension);
      } else {
        SharedSyPtr genValue;
        SharedExNdPtr genNode;

        genValue.reset(
            new IntSymbol(hp_gen_save_value(), funcLayerNum + 1, false));
        genValues.push_back(
            std::pair<SharedSyPtr, string>(genValue, dimension->_name));
        symbolTable.push_symbol(genValue);

        genNode->_type = NodeType::VAR;
        genNode->_operation = OperationType::ASSIGN;
        genNode->addChild(dimension);
        genNode->_name = genValue->_name;
        std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(genNode);
      }
    }
  } else {
    symbol.reset(new IntSymbol(name, funcLayerNum + 1, false));
  }
  params.push_back(symbol);

  symbolTable.push_symbol(symbol);
  switch (symbol->kind()) {
    case SymbolKind::Array:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::Ptr,
                                   symbol->getId());
      break;
    case SymbolKind::INT:
      irGenerator.ir_declare_param(symbol->getName(), SymbolKind::INT,
                                   symbol->getId());
      break;
    default:
      break;
  }
}